

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ProcessStatsConfig::ProcessStatsConfig
          (ProcessStatsConfig *this,ProcessStatsConfig *param_1)

{
  pointer pcVar1;
  bool bVar2;
  undefined2 uVar3;
  uint32_t uVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ProcessStatsConfig_003a15e8;
  std::
  vector<perfetto::protos::gen::ProcessStatsConfig_Quirks,_std::allocator<perfetto::protos::gen::ProcessStatsConfig_Quirks>_>
  ::vector(&this->quirks_,&param_1->quirks_);
  this->proc_stats_cache_ttl_ms_ = param_1->proc_stats_cache_ttl_ms_;
  bVar2 = param_1->record_thread_names_;
  uVar3 = *(undefined2 *)&param_1->field_0x22;
  uVar4 = param_1->proc_stats_poll_ms_;
  this->scan_all_processes_on_start_ = param_1->scan_all_processes_on_start_;
  this->record_thread_names_ = bVar2;
  *(undefined2 *)&this->field_0x22 = uVar3;
  this->proc_stats_poll_ms_ = uVar4;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ProcessStatsConfig::ProcessStatsConfig(const ProcessStatsConfig&) = default;